

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::CharClassBuilder::AddCharClass(CharClassBuilder *this,CharClassBuilder *cc)

{
  Rune lo;
  bool bVar1;
  pointer pRVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  CharClassBuilder *cc_local;
  CharClassBuilder *this_local;
  
  it._M_node = (_Base_ptr)cc;
  local_20._M_node = (_Base_ptr)begin(cc);
  while( true ) {
    local_28._M_node = (_Base_ptr)end(it._M_node);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pRVar2 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_20);
    lo = pRVar2->lo;
    pRVar2 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_20);
    AddRange(this,lo,pRVar2->hi);
    std::_Rb_tree_const_iterator<re2::RuneRange>::operator++(&local_20);
  }
  return;
}

Assistant:

void CharClassBuilder::AddCharClass(CharClassBuilder *cc) {
  for (iterator it = cc->begin(); it != cc->end(); ++it)
    AddRange(it->lo, it->hi);
}